

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.cpp
# Opt level: O3

bool __thiscall
chrono::utils::ChParserOpenSim::parseForce
          (ChParserOpenSim *this,xml_node<char> *forceNode,ChSystem *system,
          shared_ptr<chrono::ChLoadContainer> *container)

{
  double dVar1;
  int iVar2;
  ChLoadContainer *pCVar3;
  double dVar4;
  double dVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Alloc_hider _Var6;
  element_type *peVar7;
  bool bVar8;
  int iVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  xml_attribute<char> *pxVar11;
  ostream *poVar12;
  xml_node<char> *pxVar13;
  undefined7 extraout_var;
  size_t sVar14;
  undefined8 uVar15;
  char *pcVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  bool bVar18;
  double dVar19;
  bool local_199;
  string str;
  _Alloc_hider local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  shared_ptr<chrono::ChLoadBodyForce> load;
  bool local_129;
  ForceInfo local_128;
  string name;
  shared_ptr<chrono::ChBody> body;
  shared_ptr<chrono::ChBody> bodyA;
  shared_ptr<chrono::ChLoadBase> local_78;
  shared_ptr<chrono::ChLoadBase> local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pcVar16 = (forceNode->super_xml_base<char>).m_name;
  if (pcVar16 == (char *)0x0) {
    pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
  }
  std::__cxx11::string::string((string *)&str,pcVar16,(allocator *)&local_128);
  local_128.type._M_dataplus._M_p._0_1_ = 0x20;
  _Var10 = std::
           __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                     ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )str._M_dataplus._M_p,
                      (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )(str._M_dataplus._M_p + str._M_string_length),
                      (_Iter_equals_val<const_char>)&local_128);
  str._M_string_length = (long)_Var10._M_current - (long)str._M_dataplus._M_p;
  paVar17 = &local_128.type.field_2;
  *_Var10._M_current = '\0';
  local_128.type._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"PointActuator","");
  _Var6._M_p = local_128.type._M_dataplus._M_p;
  if (str._M_string_length == local_128.type._M_string_length) {
    if (str._M_string_length == 0) {
      bVar18 = true;
    }
    else {
      iVar9 = bcmp(str._M_dataplus._M_p,local_128.type._M_dataplus._M_p,str._M_string_length);
      bVar18 = iVar9 == 0;
    }
  }
  else {
    bVar18 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != paVar17) {
    operator_delete(_Var6._M_p,local_128.type.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
  }
  if (bVar18) {
    pxVar11 = rapidxml::xml_node<char>::first_attribute(forceNode,"name",0,true);
    pcVar16 = (pxVar11->super_xml_base<char>).m_value;
    if (pcVar16 == (char *)0x0) {
      pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string((string *)&name,pcVar16,(allocator *)&str);
    str._M_dataplus._M_p._0_1_ = 0x20;
    _Var10 = std::
             __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )name._M_dataplus._M_p,
                        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )(name._M_dataplus._M_p + name._M_string_length),
                        (_Iter_equals_val<const_char>)&str);
    name._M_string_length = (long)_Var10._M_current - (long)name._M_dataplus._M_p;
    *_Var10._M_current = '\0';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Actuator ",9);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,name._M_dataplus._M_p,name._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pxVar13 = rapidxml::xml_node<char>::first_node(forceNode,"body",0,true);
    pcVar16 = (pxVar13->super_xml_base<char>).m_value;
    if (pcVar16 == (char *)0x0) {
      pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string((string *)&str,pcVar16,(allocator *)&local_128);
    local_128.type._M_dataplus._M_p._0_1_ = 0x20;
    _Var10 = std::
             __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )str._M_dataplus._M_p,
                        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )(str._M_dataplus._M_p + str._M_string_length),
                        (_Iter_equals_val<const_char>)&local_128);
    str._M_string_length = (long)_Var10._M_current - (long)str._M_dataplus._M_p;
    *_Var10._M_current = '\0';
    ChAssembly::SearchBody((ChAssembly *)&body,(char *)&system->assembly);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p != &str.field_2) {
      operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
    }
    pxVar13 = rapidxml::xml_node<char>::first_node(forceNode,"point",0,true);
    pcVar16 = (pxVar13->super_xml_base<char>).m_value;
    if (pcVar16 == (char *)0x0) {
      pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    strToSTLVector<double>((vector<double,_std::allocator<double>_> *)&str,pcVar16);
    if ((pointer)str._M_string_length == str._M_dataplus._M_p) {
      uVar15 = 0;
LAB_0092d95b:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar15)
      ;
LAB_0092d969:
      uVar15 = 0;
LAB_0092d979:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar15)
      ;
    }
    else {
      if ((ulong)((long)(str._M_string_length - (long)str._M_dataplus._M_p) >> 3) < 2) {
        uVar15 = 1;
        goto LAB_0092d95b;
      }
      if (str._M_string_length - (long)str._M_dataplus._M_p == 0x10) {
        uVar15 = 2;
        goto LAB_0092d95b;
      }
      bodyA.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)str._M_dataplus._M_p;
      bodyA.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(str._M_dataplus._M_p + 8);
      operator_delete(str._M_dataplus._M_p,
                      str.field_2._M_allocated_capacity - (long)str._M_dataplus._M_p);
      pxVar13 = rapidxml::xml_node<char>::first_node(forceNode,"point_is_global",0,true);
      pcVar16 = (pxVar13->super_xml_base<char>).m_value;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      bVar18 = CStrToBool(pcVar16);
      pxVar13 = rapidxml::xml_node<char>::first_node(forceNode,"direction",0,true);
      pcVar16 = (pxVar13->super_xml_base<char>).m_value;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      strToSTLVector<double>((vector<double,_std::allocator<double>_> *)&str,pcVar16);
      if ((pointer)str._M_string_length == str._M_dataplus._M_p) goto LAB_0092d969;
      if ((ulong)((long)(str._M_string_length - (long)str._M_dataplus._M_p) >> 3) < 2) {
        uVar15 = 1;
        goto LAB_0092d979;
      }
      if (str._M_string_length - (long)str._M_dataplus._M_p == 0x10) {
        uVar15 = 2;
        goto LAB_0092d979;
      }
      dVar1 = *(double *)str._M_dataplus._M_p;
      dVar4 = *(double *)(str._M_dataplus._M_p + 8);
      dVar5 = *(double *)(str._M_dataplus._M_p + 0x10);
      operator_delete(str._M_dataplus._M_p,
                      str.field_2._M_allocated_capacity - (long)str._M_dataplus._M_p);
      pxVar13 = rapidxml::xml_node<char>::first_node(forceNode,"force_is_global",0,true);
      pcVar16 = (pxVar13->super_xml_base<char>).m_value;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      bVar8 = CStrToBool(pcVar16);
      system = (ChSystem *)(CONCAT71(extraout_var,bVar8) & 0xffffffff);
      pxVar13 = rapidxml::xml_node<char>::first_node(forceNode,"optimal_force",0,true);
      pcVar16 = (pxVar13->super_xml_base<char>).m_value;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      std::__cxx11::string::string((string *)&str,pcVar16,(allocator *)&local_128);
      local_128.type._M_dataplus._M_p._0_1_ = 0x20;
      _Var10 = std::
               __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )str._M_dataplus._M_p,
                          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )(str._M_dataplus._M_p + str._M_string_length),
                          (_Iter_equals_val<const_char>)&local_128);
      _Var6 = str._M_dataplus;
      str._M_string_length = (long)_Var10._M_current - (long)str._M_dataplus._M_p;
      *_Var10._M_current = '\0';
      forceNode = (xml_node<char> *)__errno_location();
      iVar9 = *(int *)&(forceNode->super_xml_base<char>).m_name;
      *(int *)&(forceNode->super_xml_base<char>).m_name = 0;
      dVar19 = strtod(_Var6._M_p,(char **)&local_128);
      if (local_128.type._M_dataplus._M_p != _Var6._M_p) {
        iVar2 = *(int *)&(forceNode->super_xml_base<char>).m_name;
        if (iVar2 == 0) {
          *(int *)&(forceNode->super_xml_base<char>).m_name = iVar9;
        }
        else if (iVar2 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_0092cf7b;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
        }
        str._M_dataplus._M_p = (pointer)(dVar19 * dVar1);
        str._M_string_length = (size_type)(dVar19 * dVar4);
        str.field_2._M_allocated_capacity = (size_type)(dVar19 * dVar5);
        local_129 = !bVar18;
        local_199 = (bool)((byte)system ^ 1);
        load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chrono::ChLoadBodyForce,std::allocator<chrono::ChLoadBodyForce>,std::shared_ptr<chrono::ChBody>&,chrono::ChVector<double>,bool,chrono::ChVector<double>&,bool>
                  (&load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(ChLoadBodyForce **)&load,
                   (allocator<chrono::ChLoadBodyForce> *)&local_128,&body,(ChVector<double> *)&str,
                   &local_199,(ChVector<double> *)&bodyA,&local_129);
        peVar7 = load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if (this->m_activate_actuators == false) {
          local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
          local_40 = local_38._M_pi + 1;
          (local_38._M_pi)->_M_use_count = 1;
          (local_38._M_pi)->_M_weak_count = 1;
          (local_38._M_pi)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
          local_38._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
          local_38._M_pi[1]._M_use_count = 0;
          local_38._M_pi[1]._M_weak_count = 0;
          (peVar7->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_40;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(peVar7->m_modulation).
                      super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ,&local_38);
          if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
          }
        }
        paVar17 = &local_128.type.field_2;
        pCVar3 = (container->super___shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        local_68.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_68.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        ChLoadContainer::Add(pCVar3,&local_68);
        if (local_68.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_128.type._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"PointActuator","");
        local_128.load.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_128.load.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserOpenSim::Report::ForceInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_chrono::utils::ChParserOpenSim::Report::ForceInfo,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserOpenSim::Report::ForceInfo>
                    *)&str,&name,&local_128);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>,std::allocator<std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::__cxx11::string,chrono::utils::ChParserOpenSim::Report::ForceInfo>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>,std::allocator<std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&(this->m_report).forces,&str);
        if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_p != &local_168) {
          operator_delete(local_178._M_p,local_168._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
        }
        if (local_128.load.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_128.load.
                     super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128.type._M_dataplus._M_p != paVar17) {
          operator_delete(local_128.type._M_dataplus._M_p,
                          local_128.type.field_2._M_allocated_capacity + 1);
        }
        this_00._M_pi =
             body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          this_00 = body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        }
        goto joined_r0x0092d90f;
      }
    }
    std::__throw_invalid_argument("stod");
LAB_0092d993:
    uVar15 = 0;
  }
  else {
LAB_0092cf7b:
    pcVar16 = (forceNode->super_xml_base<char>).m_name;
    if (pcVar16 == (char *)0x0) {
      pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string((string *)&str,pcVar16,(allocator *)&local_128);
    local_128.type._M_dataplus._M_p._0_1_ = 0x20;
    _Var10 = std::
             __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )str._M_dataplus._M_p,
                        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )(str._M_dataplus._M_p + str._M_string_length),
                        (_Iter_equals_val<const_char>)&local_128);
    str._M_string_length = (long)_Var10._M_current - (long)str._M_dataplus._M_p;
    paVar17 = &local_128.type.field_2;
    *_Var10._M_current = '\0';
    local_128.type._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"TorqueActuator","");
    _Var6._M_p = local_128.type._M_dataplus._M_p;
    if (str._M_string_length == local_128.type._M_string_length) {
      if (str._M_string_length == 0) {
        bVar18 = true;
      }
      else {
        iVar9 = bcmp(str._M_dataplus._M_p,local_128.type._M_dataplus._M_p,str._M_string_length);
        bVar18 = iVar9 == 0;
      }
    }
    else {
      bVar18 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p != paVar17) {
      operator_delete(_Var6._M_p,local_128.type.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p != &str.field_2) {
      operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
    }
    if (!bVar18) {
LAB_0092d5fb:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Unknown actuator type: ",0x17);
      pcVar16 = (forceNode->super_xml_base<char>).m_name;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      sVar14 = strlen(pcVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar16,sVar14);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      return false;
    }
    pxVar11 = rapidxml::xml_node<char>::first_attribute(forceNode,"name",0,true);
    pcVar16 = (pxVar11->super_xml_base<char>).m_value;
    if (pcVar16 == (char *)0x0) {
      pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string((string *)&name,pcVar16,(allocator *)&str);
    str._M_dataplus._M_p._0_1_ = 0x20;
    _Var10 = std::
             __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )name._M_dataplus._M_p,
                        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )(name._M_dataplus._M_p + name._M_string_length),
                        (_Iter_equals_val<const_char>)&str);
    name._M_string_length = (long)_Var10._M_current - (long)name._M_dataplus._M_p;
    *_Var10._M_current = '\0';
    pxVar13 = rapidxml::xml_node<char>::first_node(forceNode,"bodyA",0,true);
    pcVar16 = (pxVar13->super_xml_base<char>).m_value;
    if (pcVar16 == (char *)0x0) {
      pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string((string *)&str,pcVar16,(allocator *)&local_128);
    local_128.type._M_dataplus._M_p._0_1_ = 0x20;
    _Var10 = std::
             __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )str._M_dataplus._M_p,
                        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )(str._M_dataplus._M_p + str._M_string_length),
                        (_Iter_equals_val<const_char>)&local_128);
    str._M_string_length = (long)_Var10._M_current - (long)str._M_dataplus._M_p;
    *_Var10._M_current = '\0';
    ChAssembly::SearchBody((ChAssembly *)&bodyA,(char *)&system->assembly);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p != &str.field_2) {
      operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
    }
    pxVar13 = rapidxml::xml_node<char>::first_node(forceNode,"bodyB",0,true);
    pcVar16 = (pxVar13->super_xml_base<char>).m_value;
    if (pcVar16 == (char *)0x0) {
      pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string((string *)&str,pcVar16,(allocator *)&local_128);
    local_128.type._M_dataplus._M_p._0_1_ = 0x20;
    _Var10 = std::
             __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )str._M_dataplus._M_p,
                        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )(str._M_dataplus._M_p + str._M_string_length),
                        (_Iter_equals_val<const_char>)&local_128);
    str._M_string_length = (long)_Var10._M_current - (long)str._M_dataplus._M_p;
    *_Var10._M_current = '\0';
    ChAssembly::SearchBody((ChAssembly *)&body,(char *)&system->assembly);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p != &str.field_2) {
      operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
    }
    pxVar13 = rapidxml::xml_node<char>::first_node(forceNode,"torque_is_global",0,true);
    pcVar16 = (pxVar13->super_xml_base<char>).m_value;
    if (pcVar16 == (char *)0x0) {
      pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    bVar18 = CStrToBool(pcVar16);
    pxVar13 = rapidxml::xml_node<char>::first_node(forceNode,"axis",0,true);
    pcVar16 = (pxVar13->super_xml_base<char>).m_value;
    if (pcVar16 == (char *)0x0) {
      pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    strToSTLVector<double>((vector<double,_std::allocator<double>_> *)&str,pcVar16);
    if ((pointer)str._M_string_length == str._M_dataplus._M_p) goto LAB_0092d993;
    if ((ulong)((long)(str._M_string_length - (long)str._M_dataplus._M_p) >> 3) < 2) {
      uVar15 = 1;
    }
    else {
      if (str._M_string_length - (long)str._M_dataplus._M_p != 0x10) {
        dVar1 = *(double *)str._M_dataplus._M_p;
        dVar4 = *(double *)(str._M_dataplus._M_p + 8);
        dVar5 = *(double *)(str._M_dataplus._M_p + 0x10);
        operator_delete(str._M_dataplus._M_p,
                        str.field_2._M_allocated_capacity - (long)str._M_dataplus._M_p);
        pxVar13 = rapidxml::xml_node<char>::first_node(forceNode,"optimal_force",0,true);
        pcVar16 = (pxVar13->super_xml_base<char>).m_value;
        if (pcVar16 == (char *)0x0) {
          pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
        }
        std::__cxx11::string::string((string *)&str,pcVar16,(allocator *)&load);
        _Var6 = str._M_dataplus;
        forceNode = (xml_node<char> *)__errno_location();
        iVar9 = *(int *)&(forceNode->super_xml_base<char>).m_name;
        *(int *)&(forceNode->super_xml_base<char>).m_name = 0;
        dVar19 = strtod(_Var6._M_p,(char **)&local_128);
        if (local_128.type._M_dataplus._M_p != _Var6._M_p) {
          iVar2 = *(int *)&(forceNode->super_xml_base<char>).m_name;
          if (iVar2 == 0) {
            *(int *)&(forceNode->super_xml_base<char>).m_name = iVar9;
          }
          else if (iVar2 == 0x22) {
            std::__throw_out_of_range("stod");
            goto LAB_0092d5fb;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)str._M_dataplus._M_p != &str.field_2) {
            operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
          }
          str._M_dataplus._M_p = (pointer)(dVar19 * dVar1);
          str._M_string_length = (size_type)(dVar19 * dVar4);
          str.field_2._M_allocated_capacity = (size_type)(dVar19 * dVar5);
          local_199 = !bVar18;
          load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::ChLoadBodyBodyTorque,std::allocator<chrono::ChLoadBodyBodyTorque>,std::shared_ptr<chrono::ChBody>&,std::shared_ptr<chrono::ChBody>&,chrono::ChVector<double>,bool>
                    (&load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(ChLoadBodyBodyTorque **)&load,
                     (allocator<chrono::ChLoadBodyBodyTorque> *)&local_128,&body,&bodyA,
                     (ChVector<double> *)&str,&local_199);
          peVar7 = load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if (this->m_activate_actuators == false) {
            local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
            local_50 = local_48._M_pi + 1;
            (local_48._M_pi)->_M_use_count = 1;
            (local_48._M_pi)->_M_weak_count = 1;
            (local_48._M_pi)->_vptr__Sp_counted_base =
                 (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
            local_48._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
            local_48._M_pi[1]._M_use_count = 0;
            local_48._M_pi[1]._M_weak_count = 0;
            peVar7[5].super_ChLoadCustom.loadable.
            super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 local_50;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &peVar7[5].super_ChLoadCustom.load_Q,&local_48);
            if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
            }
          }
          paVar17 = &local_128.type.field_2;
          pCVar3 = (container->
                   super___shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_78.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_78.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          ChLoadContainer::Add(pCVar3,&local_78);
          if ((element_type *)
              local_78.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          local_128.type._M_dataplus._M_p = (pointer)paVar17;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"TorqueActuator","");
          local_128.load.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_128.load.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserOpenSim::Report::ForceInfo>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_chrono::utils::ChParserOpenSim::Report::ForceInfo,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserOpenSim::Report::ForceInfo>
                      *)&str,&name,&local_128);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>,std::allocator<std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<std::__cxx11::string,chrono::utils::ChParserOpenSim::Report::ForceInfo>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>,std::allocator<std::pair<std::__cxx11::string_const,chrono::utils::ChParserOpenSim::Report::ForceInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&(this->m_report).forces,&str);
          if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_p != &local_168) {
            operator_delete(local_178._M_p,local_168._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)str._M_dataplus._M_p != &str.field_2) {
            operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
          }
          if (local_128.load.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_128.load.
                       super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128.type._M_dataplus._M_p != paVar17) {
            operator_delete(local_128.type._M_dataplus._M_p,
                            local_128.type.field_2._M_allocated_capacity + 1);
          }
          if (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          this_00._M_pi =
               bodyA.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
          if (body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            this_00 = bodyA.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
          }
joined_r0x0092d90f:
          if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          return true;
        }
        goto LAB_0092d9b1;
      }
      uVar15 = 2;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar15);
LAB_0092d9b1:
  uVar15 = std::__throw_invalid_argument("stod");
  if (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (load.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (bodyA.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (bodyA.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar15);
}

Assistant:

bool ChParserOpenSim::parseForce(rapidxml::xml_node<>* forceNode,
                                 ChSystem& system,
                                 std::shared_ptr<ChLoadContainer> container) {
    if (stringStripCStr(forceNode->name()) == std::string("PointActuator")) {
        std::string name = stringStripCStr(forceNode->first_attribute("name")->value());
        std::cout << "Actuator " << name << std::endl;
        // Chrono should be using std::string
        auto body = system.SearchBody(stringStripCStr(forceNode->first_node("body")->value()).c_str());
        ChVector<> point = strToChVector<double>(forceNode->first_node("point")->value());
        auto point_global = CStrToBool(forceNode->first_node("point_is_global")->value());
        ChVector<> direction = strToChVector<double>(forceNode->first_node("direction")->value());
        auto force_global = CStrToBool(forceNode->first_node("force_is_global")->value());
        auto max_force = std::stod(stringStripCStr(forceNode->first_node("optimal_force")->value()));

        auto load = chrono_types::make_shared<ChLoadBodyForce>(body, max_force * direction, !force_global, point, !point_global);
        if (!m_activate_actuators)
            load->SetModulationFunction(chrono_types::make_shared<ChFunction_Const>(0));
        container->Add(load);

        m_report.forces.insert(std::make_pair(name, Report::ForceInfo{std::string("PointActuator"), load}));

        return true;
    } else if (stringStripCStr(forceNode->name()) == std::string("TorqueActuator")) {
        std::string name = stringStripCStr(forceNode->first_attribute("name")->value());
        auto bodyA = system.SearchBody(stringStripCStr(forceNode->first_node("bodyA")->value()).c_str());
        auto bodyB = system.SearchBody(stringStripCStr(forceNode->first_node("bodyB")->value()).c_str());
        auto torque_is_global = CStrToBool(forceNode->first_node("torque_is_global")->value());
        ChVector<> axis = strToChVector<double>(forceNode->first_node("axis")->value());
        auto max_force = std::stod(forceNode->first_node("optimal_force")->value());

        // Note: OpenSim assumes the specified torque is applied to bodyA (with an equal and opposite
        // torque applied to bodyB).  In ChLoadBodyBodyTorque, the torque is applied to the 2nd body
        // passed in its constructor.
        auto load = chrono_types::make_shared<ChLoadBodyBodyTorque>(bodyB, bodyA, max_force * axis, !torque_is_global);
        if (!m_activate_actuators)
            load->SetModulationFunction(chrono_types::make_shared<ChFunction_Const>(0));
        container->Add(load);

        m_report.forces.insert(std::make_pair(name, Report::ForceInfo{std::string("TorqueActuator"), load}));

        return true;
    }

    std::cout << "Unknown actuator type: " << forceNode->name() << std::endl;
    return false;
}